

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec2 __thiscall djb::tab::cdfv(tab *this,vec2 *u,vec3 *wi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float_t u_00;
  float_t u_01;
  pointer pvVar6;
  vec2 vVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float_t w4;
  float_t w3;
  float_t w2;
  float_t w1;
  int i2;
  int i1;
  int l2;
  int l1;
  int k2;
  int k1;
  int j2;
  int j1;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  fVar18 = 0.0;
  if (wi->z <= 1.0 && wi->z != 1.0) {
    fVar18 = atan2f(wi->y,wi->x);
  }
  u_00 = u->x;
  u_01 = u->y;
  fVar19 = acosf(wi->z);
  spline::uwrap_edge(u_00,0x200,&local_4c,&local_50,&local_54);
  spline::uwrap_edge(u_01,0x40,&local_34,&local_38,&local_58);
  spline::uwrap_edge(fVar19 * 0.63661975 * fVar19 * 0.63661975,0x10,&local_3c,&local_40,&local_5c);
  spline::uwrap_repeat((fVar18 / 3.1415927 + 1.0) * 0.5,0x20,&local_44,&local_48,&local_60);
  iVar1 = local_44 * 0x400 + local_3c * 0x40;
  iVar12 = local_44 * 0x400 + local_40 * 0x40;
  iVar10 = local_3c * 0x40 + local_48 * 0x400;
  iVar9 = local_48 * 0x400 + local_40 * 0x40;
  iVar15 = (iVar1 + local_34) * 0x200;
  iVar2 = iVar15 + local_4c;
  iVar15 = iVar15 + local_50;
  iVar14 = (iVar1 + local_38) * 0x200;
  iVar1 = iVar14 + local_4c;
  iVar14 = iVar14 + local_50;
  iVar16 = (iVar12 + local_34) * 0x200;
  iVar3 = iVar16 + local_4c;
  iVar16 = iVar16 + local_50;
  iVar13 = (iVar12 + local_38) * 0x200;
  iVar12 = iVar13 + local_4c;
  iVar13 = iVar13 + local_50;
  iVar17 = (iVar10 + local_34) * 0x200;
  iVar4 = iVar17 + local_4c;
  iVar17 = iVar17 + local_50;
  iVar11 = (iVar10 + local_38) * 0x200;
  iVar10 = iVar11 + local_4c;
  iVar11 = iVar11 + local_50;
  iVar8 = (local_34 + iVar9) * 0x200;
  iVar5 = iVar8 + local_4c;
  iVar8 = iVar8 + local_50;
  iVar9 = (iVar9 + local_38) * 0x200;
  local_4c = local_4c + iVar9;
  iVar9 = iVar9 + local_50;
  pvVar6 = (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar20 = (pvVar6[iVar15].x - pvVar6[iVar2].x) * local_54 + pvVar6[iVar2].x;
  fVar18 = (pvVar6[iVar15].y - pvVar6[iVar2].y) * local_54 + pvVar6[iVar2].y;
  fVar22 = (pvVar6[iVar16].x - pvVar6[iVar3].x) * local_54 + pvVar6[iVar3].x;
  fVar19 = (pvVar6[iVar16].y - pvVar6[iVar3].y) * local_54 + pvVar6[iVar3].y;
  fVar24 = (pvVar6[iVar17].x - pvVar6[iVar4].x) * local_54 + pvVar6[iVar4].x;
  fVar23 = (pvVar6[iVar17].y - pvVar6[iVar4].y) * local_54 + pvVar6[iVar4].y;
  fVar21 = (pvVar6[iVar8].x - pvVar6[iVar5].x) * local_54 + pvVar6[iVar5].x;
  fVar25 = (pvVar6[iVar8].y - pvVar6[iVar5].y) * local_54 + pvVar6[iVar5].y;
  fVar20 = (((pvVar6[iVar14].x - pvVar6[iVar1].x) * local_54 + pvVar6[iVar1].x) - fVar20) * local_58
           + fVar20;
  fVar18 = (((pvVar6[iVar14].y - pvVar6[iVar1].y) * local_54 + pvVar6[iVar1].y) - fVar18) * local_58
           + fVar18;
  fVar24 = (((pvVar6[iVar11].x - pvVar6[iVar10].x) * local_54 + pvVar6[iVar10].x) - fVar24) *
           local_58 + fVar24;
  fVar23 = (((pvVar6[iVar11].y - pvVar6[iVar10].y) * local_54 + pvVar6[iVar10].y) - fVar23) *
           local_58 + fVar23;
  fVar20 = (((((pvVar6[iVar13].x - pvVar6[iVar12].x) * local_54 + pvVar6[iVar12].x) - fVar22) *
             local_58 + fVar22) - fVar20) * local_5c + fVar20;
  fVar18 = (((((pvVar6[iVar13].y - pvVar6[iVar12].y) * local_54 + pvVar6[iVar12].y) - fVar19) *
             local_58 + fVar19) - fVar18) * local_5c + fVar18;
  vVar7.y = (((((((pvVar6[iVar9].y - pvVar6[local_4c].y) * local_54 + pvVar6[local_4c].y) - fVar25)
                * local_58 + fVar25) - fVar23) * local_5c + fVar23) - fVar18) * local_60 + fVar18;
  vVar7.x = (((((((pvVar6[iVar9].x - pvVar6[local_4c].x) * local_54 + pvVar6[local_4c].x) - fVar21)
                * local_58 + fVar21) - fVar24) * local_5c + fVar24) - fVar20) * local_60 + fVar20;
  return vVar7;
}

Assistant:

vec2 tab::cdfv(const vec2 &u, const vec3 &wi) const
{
	int res1 = 512;
	int res2 = 64;
	int res3 = 16;
	int res4 = 32;
	float_t pi = wi.z < 1 ? atan2(wi.y, wi.x) : 0;
	float_t u1 = u.x;
	float_t u2 = u.y;
	float_t u3 = sqr(acos(wi.z) * (2 / m_pi()));
	float_t u4 = (pi / m_pi() + 1) / 2;

	return spline::eval4d(m_cdf,
	                      res1, res2, res3, res4,
	                      spline::uwrap_edge  , u1,
	                      spline::uwrap_edge  , u2,
	                      spline::uwrap_edge  , u3,
	                      spline::uwrap_repeat, u4);
}